

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_ObjRight(Cba_Ntk_t *p,int i)

{
  int iVar1;
  
  iVar1 = Cba_ObjFon0(p,i);
  iVar1 = Cba_FonRange(p,iVar1);
  iVar1 = Cba_NtkRangeRight(p,iVar1);
  return iVar1;
}

Assistant:

static inline int            Cba_ObjRight( Cba_Ntk_t * p, int i )            { return Cba_FonRight( p, Cba_ObjFon0(p, i) );                                                }